

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileselector.cpp
# Opt level: O1

int __thiscall
QFileSelectorPrivate::select
          (QFileSelectorPrivate *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  QFileSelector *this_00;
  _func_int **pp_Var1;
  Data *pDVar2;
  qsizetype qVar3;
  char16_t *pcVar4;
  Data *data;
  bool bVar5;
  longlong __old_val;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QFileInfo fi;
  QString local_a8;
  QString local_88;
  QString local_68;
  QFileInfo local_50;
  QArrayDataPointer<QString> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileSelector **)(CONCAT44(in_register_00000034,__nfds) + 8);
  local_50.d_ptr.d.ptr = (QSharedDataPointer<QFileInfoPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo(&local_50,(QString *)__readfds);
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char16_t *)0x0;
  local_68.d.size = 0;
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::path(&local_88,&local_50);
  if ((undefined1 *)local_88.d.size != (undefined1 *)0x0) {
    bVar5 = QString::endsWith(&local_88,(QChar)0x2f,CaseSensitive);
    if (bVar5) {
      local_a8.d.d = local_88.d.d;
      local_a8.d.ptr = local_88.d.ptr;
      local_a8.d.size = local_88.d.size;
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      local_48.ptr._0_2_ = 0x2f;
      local_48.d = (Data *)&local_88;
      QStringBuilder<QString_&,_char16_t>::convertTo<QString>
                (&local_a8,(QStringBuilder<QString_&,_char16_t> *)&local_48);
    }
    pcVar4 = local_68.d.ptr;
    data = local_68.d.d;
    qVar3 = local_a8.d.size;
    pDVar2 = local_a8.d.d;
    local_a8.d.d = local_68.d.d;
    local_68.d.d = pDVar2;
    local_68.d.ptr = local_a8.d.ptr;
    local_a8.d.ptr = pcVar4;
    local_a8.d.size = local_68.d.size;
    local_68.d.size = qVar3;
    if (&data->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&data->super_QArrayData,2,0x10);
      }
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::fileName(&local_a8,&local_50);
  QFileSelector::allSelectors((QStringList *)&local_48,this_00);
  selectionHelper(&local_88,&local_68,&local_a8,(QStringList *)&local_48,(QChar)0x2b);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  qVar3 = local_88.d.size;
  pcVar4 = local_88.d.ptr;
  pDVar2 = local_88.d.d;
  if ((QObject *)local_88.d.size == (QObject *)0x0) {
    pp_Var1 = (_func_int **)__readfds->fds_bits[0];
    (this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData = pp_Var1;
    (this->super_QObjectPrivate).super_QObjectData.q_ptr = (QObject *)__readfds->fds_bits[1];
    (this->super_QObjectPrivate).super_QObjectData.parent = (QObject *)__readfds->fds_bits[2];
    if (pp_Var1 != (_func_int **)0x0) {
      LOCK();
      *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
      UNLOCK();
    }
  }
  else {
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = (char16_t *)0x0;
    (this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData = (_func_int **)pDVar2;
    (this->super_QObjectPrivate).super_QObjectData.q_ptr = (QObject *)pcVar4;
    local_88.d.size = 0;
    (this->super_QObjectPrivate).super_QObjectData.parent = (QObject *)qVar3;
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  QFileInfo::~QFileInfo(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)this;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSelectorPrivate::select(const QString &filePath) const
{
    Q_Q(const QFileSelector);
    QFileInfo fi(filePath);

    QString pathString;
    if (auto path = fi.path(); !path.isEmpty())
        pathString = path.endsWith(u'/') ? path : path + u'/';
    QString ret = selectionHelper(pathString,
            fi.fileName(), q->allSelectors());

    if (!ret.isEmpty())
        return ret;
    return filePath;
}